

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O2

double __thiscall
NoMeEdgeCalculator::scoreSequences
          (NoMeEdgeCalculator *this,string *code1,string *qual1,string *code2,string *qual2,
          int start1,int end1,int start2,int end2,bool isStrand1,bool isClique,int numGCAllowedPos,
          int ct)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  difference_type dVar7;
  difference_type dVar8;
  difference_type dVar9;
  difference_type dVar10;
  hmm *this_00;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  int iVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double local_208;
  int local_1fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string *local_1d8;
  int rightNonOverlapGCCount;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateMap;
  auto_ptr<hmm> hmmProbability;
  string compareString1;
  string compareString2;
  string compareQual1;
  string compareQual2;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_1d8 = qual1;
  lVar5 = std::__cxx11::string::find((char *)code1,0x1b0510);
  if ((lVar5 == -1) && (lVar5 = std::__cxx11::string::find((char *)code1,0x1b050d), lVar5 == -1)) {
    return -1.0;
  }
  iVar11 = 0;
  lVar5 = std::__cxx11::string::find((char *)code2,0x1b0510);
  if ((lVar5 == -1) && (lVar5 = std::__cxx11::string::find((char *)code2,0x1b050d), lVar5 == -1)) {
    return -1.0;
  }
  iVar12 = start1 - start2;
  if (start1 - start2 == 0 || start1 < start2) {
    iVar12 = 0;
  }
  if (start1 < start2) {
    iVar12 = 0;
    iVar11 = -(start1 - start2);
  }
  if (end1 < end2) {
    if (start2 < start1) {
LAB_0017e351:
      iVar4 = -start1;
    }
    else {
      if (start2 <= start1) {
        if (start1 != start2) {
LAB_0017e785:
          local_1fc = 0;
          goto LAB_0017e39a;
        }
        goto LAB_0017e351;
      }
LAB_0017e37e:
      iVar4 = -start2;
    }
    local_1fc = end1 + iVar4 + 1;
LAB_0017e38e:
    if (local_1fc < 0) {
      return -1.0;
    }
  }
  else {
    if (end2 < end1) {
      if (start2 < start1) {
LAB_0017e35b:
        local_1fc = (end2 - start1) + 1;
      }
      else {
        if (start2 <= start1) {
          if (start1 != start2) goto LAB_0017e785;
          goto LAB_0017e35b;
        }
        local_1fc = end2 - start2;
      }
      goto LAB_0017e38e;
    }
    local_1fc = 0;
    if (end1 == end2) {
      if (start1 < start2) goto LAB_0017e37e;
      if ((start1 != start2 && start2 <= start1) || (start1 == start2)) goto LAB_0017e351;
    }
  }
LAB_0017e39a:
  std::__cxx11::string::string((string *)&compareString1,"",(allocator *)&switchRateMap);
  std::__cxx11::string::string((string *)&compareQual1,"",(allocator *)&switchRateMap);
  std::__cxx11::string::string((string *)&compareString2,"",(allocator *)&switchRateMap);
  std::__cxx11::string::string((string *)&compareQual2,"",(allocator *)&switchRateMap);
  rightNonOverlapGCCount = 0;
  if (iVar11 == iVar12) {
    std::__cxx11::string::_M_assign((string *)&compareString1);
    std::__cxx11::string::_M_assign((string *)&compareQual1);
    std::__cxx11::string::_M_assign((string *)&compareString2);
    std::__cxx11::string::_M_assign((string *)&compareQual2);
  }
  else {
    if (iVar12 == 0) {
      std::__cxx11::string::_M_assign((string *)&compareString2);
      std::__cxx11::string::_M_assign((string *)&compareQual2);
      std::__cxx11::string::string((string *)&switchRateMap,"0",(allocator *)&hmmProbability);
      std::__cxx11::string::string((string *)&hmmProbability,"0",(allocator *)&local_1f8);
      iVar12 = 0;
      for (uVar13 = 0; (uVar13 < code1->_M_string_length && (uVar13 < local_1d8->_M_string_length));
          uVar13 = uVar13 + 1) {
        pcVar6 = (char *)std::__cxx11::string::at((ulong)code1);
        if ((*pcVar6 == 'O') ||
           (pcVar6 = (char *)std::__cxx11::string::at((ulong)code1), *pcVar6 == 'C')) {
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&switchRateMap,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&hmmProbability);
          if (bVar3) goto LAB_0017e792;
          iVar4 = std::__cxx11::stoi((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&switchRateMap,(size_t *)0x0,10);
          iVar4 = iVar4 + iVar12;
          iVar12 = iVar4 - iVar11;
          if (iVar12 == 0) {
            std::__cxx11::string::substr((ulong)&local_1f8,(ulong)code1);
            std::__cxx11::string::append((string *)&compareString1);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::substr((ulong)&local_1f8,(ulong)local_1d8);
            std::__cxx11::string::append((string *)&compareQual1);
            goto LAB_0017e9d3;
          }
          if (iVar12 != 0 && iVar11 <= iVar4) {
            std::__cxx11::to_string(&local_1f8,iVar12);
            std::__cxx11::string::append((string *)&compareString1);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::to_string(&local_1f8,iVar12);
            std::__cxx11::string::append((string *)&compareQual1);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::substr((ulong)&local_1f8,(ulong)code1);
            std::__cxx11::string::append((string *)&compareString1);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::substr((ulong)&local_1f8,(ulong)local_1d8);
            std::__cxx11::string::append((string *)&compareQual1);
            goto LAB_0017e9d3;
          }
          std::__cxx11::string::assign((char *)&switchRateMap);
          std::__cxx11::string::assign((char *)&hmmProbability);
          iVar12 = iVar4 + 2;
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::at((ulong)code1);
          std::operator+(&local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &switchRateMap,*pcVar6);
          std::__cxx11::string::operator=((string *)&switchRateMap,(string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          pcVar6 = (char *)std::__cxx11::string::at((ulong)code1);
          std::operator+(&local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &hmmProbability,*pcVar6);
          std::__cxx11::string::operator=((string *)&hmmProbability,(string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
        }
      }
    }
    else {
      if (iVar11 != 0) goto LAB_0017e9f4;
      std::__cxx11::string::_M_assign((string *)&compareString1);
      std::__cxx11::string::_M_assign((string *)&compareQual1);
      std::__cxx11::string::string((string *)&switchRateMap,"0",(allocator *)&hmmProbability);
      std::__cxx11::string::string((string *)&hmmProbability,"0",(allocator *)&local_1f8);
      uVar13 = 0;
      iVar11 = 0;
      local_1d8 = qual2;
LAB_0017e4d5:
      if ((code2->_M_string_length <= uVar13) || (local_1d8->_M_string_length <= uVar13))
      goto LAB_0017e9dd;
      pcVar6 = (char *)std::__cxx11::string::at((ulong)code2);
      if ((*pcVar6 != 'O') &&
         (pcVar6 = (char *)std::__cxx11::string::at((ulong)code2), *pcVar6 != 'C')) {
        pcVar6 = (char *)std::__cxx11::string::at((ulong)code2);
        std::operator+(&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &switchRateMap,*pcVar6);
        std::__cxx11::string::operator=((string *)&switchRateMap,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        pcVar6 = (char *)std::__cxx11::string::at((ulong)code2);
        std::operator+(&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &hmmProbability,*pcVar6);
        std::__cxx11::string::operator=((string *)&hmmProbability,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
LAB_0017e5e4:
        uVar13 = uVar13 + 1;
        goto LAB_0017e4d5;
      }
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &switchRateMap,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &hmmProbability);
      if (bVar3) goto LAB_0017e792;
      iVar4 = std::__cxx11::stoi((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&switchRateMap,(size_t *)0x0,10);
      iVar4 = iVar4 + iVar11;
      iVar11 = iVar4 - iVar12;
      if (iVar11 != 0) {
        if (iVar11 != 0 && iVar12 <= iVar4) {
          std::__cxx11::to_string(&local_1f8,iVar11);
          std::__cxx11::string::append((string *)&compareString2);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::to_string(&local_1f8,iVar11);
          std::__cxx11::string::append((string *)&compareQual2);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::substr((ulong)&local_1f8,(ulong)code2);
          std::__cxx11::string::append((string *)&compareString2);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::substr((ulong)&local_1f8,(ulong)local_1d8);
          std::__cxx11::string::append((string *)&compareQual2);
          goto LAB_0017e9d3;
        }
        std::__cxx11::string::assign((char *)&switchRateMap);
        std::__cxx11::string::assign((char *)&hmmProbability);
        iVar11 = iVar4 + 2;
        goto LAB_0017e5e4;
      }
      std::__cxx11::string::substr((ulong)&local_1f8,(ulong)code2);
      std::__cxx11::string::append((string *)&compareString2);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::substr((ulong)&local_1f8,(ulong)local_1d8);
      std::__cxx11::string::append((string *)&compareQual2);
LAB_0017e9d3:
      std::__cxx11::string::~string((string *)&local_1f8);
    }
LAB_0017e9dd:
    std::__cxx11::string::~string((string *)&hmmProbability);
    std::__cxx11::string::~string((string *)&switchRateMap);
  }
LAB_0017e9f4:
  if (compareString1._M_string_length == 0) {
    std::__cxx11::to_string((string *)&switchRateMap,local_1fc);
    std::__cxx11::string::append((string *)&compareString1);
    std::__cxx11::string::~string((string *)&switchRateMap);
    std::__cxx11::to_string((string *)&switchRateMap,local_1fc);
    std::__cxx11::string::append((string *)&compareQual1);
LAB_0017eaa4:
    std::__cxx11::string::~string((string *)&switchRateMap);
  }
  else if (compareString2._M_string_length == 0) {
    std::__cxx11::to_string((string *)&switchRateMap,local_1fc);
    std::__cxx11::string::append((string *)&compareString2);
    std::__cxx11::string::~string((string *)&switchRateMap);
    std::__cxx11::to_string((string *)&switchRateMap,local_1fc);
    std::__cxx11::string::append((string *)&compareQual2);
    goto LAB_0017eaa4;
  }
  sVar2 = compareString2._M_string_length;
  sVar1 = compareString1._M_string_length;
  if (compareString1._M_string_length < compareString2._M_string_length) {
    trimCodes(&compareString1,&compareQual1,local_1fc,&rightNonOverlapGCCount,false);
  }
  else {
    trimCodes(&compareString1,&compareQual1,local_1fc,&rightNonOverlapGCCount,
              compareString2._M_string_length < compareString1._M_string_length);
  }
  trimCodes(&compareString2,&compareQual2,local_1fc,&rightNonOverlapGCCount,sVar1 < sVar2);
  switchRateMap._M_h._M_buckets = (__buckets_ptr)CONCAT71(switchRateMap._M_h._M_buckets._1_7_,0x4f);
  dVar7 = std::
          __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )compareString1._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(compareString1._M_dataplus._M_p + compareString1._M_string_length),
                     (_Iter_equals_val<const_char>)&switchRateMap);
  hmmProbability._M_ptr._0_1_ = 0x43;
  dVar8 = std::
          __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )compareString1._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(compareString1._M_dataplus._M_p + compareString1._M_string_length),
                     (_Iter_equals_val<const_char>)&hmmProbability);
  switchRateMap._M_h._M_buckets = (__buckets_ptr)CONCAT71(switchRateMap._M_h._M_buckets._1_7_,0x4f);
  dVar9 = std::
          __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )compareString2._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(compareString2._M_dataplus._M_p + compareString2._M_string_length),
                     (_Iter_equals_val<const_char>)&switchRateMap);
  hmmProbability._M_ptr._0_1_ = 0x43;
  dVar10 = std::
           __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )compareString2._M_dataplus._M_p,
                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(compareString2._M_dataplus._M_p + compareString2._M_string_length),
                      (_Iter_equals_val<const_char>)&hmmProbability);
  iVar11 = (int)dVar8 + (int)dVar7;
  local_208 = -1.0;
  if (((numGCAllowedPos <= iVar11) && (iVar11 == (int)dVar10 + (int)dVar9)) &&
     (compareString1._M_string_length == compareString2._M_string_length)) {
    switchRateMap._M_h._M_buckets = &switchRateMap._M_h._M_single_bucket;
    switchRateMap._M_h._M_bucket_count = 1;
    switchRateMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    switchRateMap._M_h._M_element_count = 0;
    switchRateMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    switchRateMap._M_h._M_rehash_policy._M_next_resize = 0;
    switchRateMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
    __ht = &(this->switchRateRS)._M_h;
    if (isStrand1) {
      __ht = &(this->switchRateFS)._M_h;
    }
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::operator=(&switchRateMap._M_h,__ht);
    this_00 = (hmm *)operator_new(0x250);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_68,&switchRateMap._M_h);
    std::__cxx11::string::string((string *)&local_88,(string *)&compareString1);
    std::__cxx11::string::string((string *)&local_a8,(string *)&compareQual1);
    std::__cxx11::string::string((string *)&local_c8,(string *)&compareString2);
    std::__cxx11::string::string((string *)&local_e8,(string *)&compareQual2);
    hmm::hmm(this_00,(unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)&local_68,&local_88,&local_a8,&local_c8,&local_e8,numGCAllowedPos);
    hmmProbability._M_ptr = this_00;
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    dVar14 = hmm::calculateProbability(this_00);
    if ((dVar14 != -1000.0) || (NAN(dVar14))) {
      local_208 = *(double *)
                   (&DAT_001aed70 +
                   (ulong)(this->nomeParam <= dVar14 && dVar14 != this->nomeParam) * 8);
    }
    else {
      local_208 = -1.0;
    }
    std::auto_ptr<hmm>::~auto_ptr(&hmmProbability);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&switchRateMap._M_h);
  }
LAB_0017ed95:
  std::__cxx11::string::~string((string *)&compareQual2);
  std::__cxx11::string::~string((string *)&compareString2);
  std::__cxx11::string::~string((string *)&compareQual1);
  std::__cxx11::string::~string((string *)&compareString1);
  return local_208;
LAB_0017e792:
  std::__cxx11::string::~string((string *)&hmmProbability);
  std::__cxx11::string::~string((string *)&switchRateMap);
  local_208 = -1.0;
  goto LAB_0017ed95;
}

Assistant:

double NoMeEdgeCalculator::scoreSequences(std::string code1,std::string qual1, std::string code2,std::string qual2 , int start1, int end1, int start2, int end2 , bool isStrand1,bool isClique,int numGCAllowedPos, int ct) const{

    if((code1.find("C") != std::string::npos) || (code1.find("O") != std::string::npos)){
        if((code2.find("C") != std::string::npos) || (code2.find("O") != std::string::npos)){

        }else{
            return -1;
        }
    }else{
        return -1;
    }

    int overlap= 0;
    int s1=0;
    int s2=0;
    if(start1<start2){
        s2 = 0;
        s1 = start2-start1;
    }else if (start1>start2) {
        s1=0;
        s2=start1-start2;
    }else if (start1==start2) {
        s1=0;
        s2=0;
    }

    if(end1<end2){
        if(start1>start2){
            //          ----------------
           //     -------------------------------
            overlap=end1-start1+1;
        }else if (start1<start2) {
            //     --------------
            //        -----------------
            overlap=end1-start2+1;
        }else if (start1==start2) {
            //     -------------
            //     -----------------------
            overlap=end1-start1+1;
        }

    }else if (end1>end2) {
        if(start1>start2){
            //               ------------------
            //        -----------------
            overlap=end2-start1+1;
        }else if (start1<start2) {
            //     --------------------
            //        -----------
            overlap=end2-start2;
        }else if (start1==start2) {
            //        ------------------
            //        -----------
            overlap=end2-start1+1;
        }
    }else if (end1==end2) {
        if(start1<start2){
            //        ------------------
            //             -------------
            overlap=end1-start2+1;
        }else if (start1>start2) {
            //               -----------
            //        ------------------
            overlap=end1-start1+1;
        }else if (start1 == start2) {
            //        ------------------
            //        ------------------
            overlap=end1-start1+1 ;
        }
    }

    if(overlap<0){
        return -1;
    }


    string compareString1="";
    string compareQual1="";
    string compareString2="";
    string compareQual2="";
    int leftNonOverlapGCCount = -1;
    int rightNonOverlapGCCount = 0;

    if(s1==s2){
        leftNonOverlapGCCount = 0;
        compareString1 = code1;
        compareQual1 = qual1;
        compareString2 = code2;
        compareQual2 = qual2;
    }else if(s2==0){
        compareString2 = code2;
        compareQual2 = qual2;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code1.size() && i<qual1.size()){
            if(code1.at(i)=='O'||code1.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s1){
                    compareString1 += code1.substr(i);
                    compareQual1 += qual1.substr(i);
                    break;
                }else if(distance>s1){
                   compareString1 += std::to_string(distance - s1);
                   compareQual1 += std::to_string(distance - s1);
                   compareString1 += code1.substr(i);
                   compareQual1 += qual1.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code1.at(i);
                prevCountQual = prevCountQual + code1.at(i);
                i++;
            }
        }
    }else if(s1==0){
        compareString1 = code1;
        compareQual1 = qual1;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code2.size() && i<qual2.size()){
            if(code2.at(i)=='O'||code2.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s2){
                    compareString2 += code2.substr(i);
                    compareQual2 += qual2.substr(i);
                    break;
                }else if(distance>s2){
                   compareString2 += std::to_string(distance - s2);
                   compareQual2 += std::to_string(distance - s2);
                   compareString2 += code2.substr(i);
                   compareQual2 += qual2.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code2.at(i);
                prevCountQual = prevCountQual + code2.at(i);
                i++;
            }
        }
    }

    if(compareString1.size()==0){
        compareString1 += std::to_string(overlap);
        compareQual1 += std::to_string(overlap);
    }else if(compareString2.size()==0){
        compareString2 += std::to_string(overlap);
        compareQual2 += std::to_string(overlap);
    }
      if(compareString1.size()>compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,true);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }else if(compareString1.size()<compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,true);
    }else{
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }

    int numberOfPositions1= std::count(compareString1.begin(), compareString1.end(), 'O') + std::count(compareString1.begin(), compareString1.end(), 'C');
    int numberOfPositions2= std::count(compareString2.begin(), compareString2.end(), 'O') + std::count(compareString2.begin(), compareString2.end(), 'C');
    if(numberOfPositions1!=numberOfPositions2) return -1;

    if(numberOfPositions1<numGCAllowedPos){
        return -1;
    }


    if(compareString1.size()!=compareString2.size()){
        return -1;
    }


    //Needed for checking the non overlapping sections
//    if(nonOverlap>0){
//        if(leftNonOverlapGCCount>nonOverlap || rightNonOverlapGCCount>nonOverlap){
//            return -1;
//        }
//    }

    std::unordered_map<int, double> switchRateMap;
    if(isStrand1){
        switchRateMap = this->switchRateFS;
    }else{
        switchRateMap = this->switchRateRS;
    }
    std::auto_ptr<hmm> hmmProbability(new hmm(switchRateMap,compareString1,compareQual1,compareString2,compareQual2,numGCAllowedPos));

   double score = hmmProbability->calculateProbability();
   double prob = nomeParam;

   if(score == -1000){//meaning that there is something wrong with the codes
       return -1;
   }else{
//       //For ideal Graph
//       //specificPositionErrorMap[numberOfPositions1] = std::make_pair((specificPositionErrorMap[numberOfPositions1].first+1),(specificPositionErrorMap[numberOfPositions1].second));
//       return 1;
       //For normal edge Criterion
       if(score > prob){
           return 1;
       }else{
           return -1;
       }
   }
}